

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCopyPixels.cpp
# Opt level: O3

void anon_unknown.dwarf_321d5f::writeCopyRead
               (string *tempDir,int w,int h,int xs,int ys,int dx,int dy)

{
  ulong *__s;
  ulong *__s_00;
  float fVar1;
  pointer pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  _Alloc_hider _Var6;
  _Alloc_hider _Var7;
  bool bVar8;
  bool bVar9;
  char cVar10;
  _Rb_tree_color _Var11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  ostream *poVar20;
  long *plVar21;
  int *piVar22;
  undefined4 *puVar23;
  char *pcVar24;
  half *phVar25;
  Header *pHVar26;
  long lVar27;
  void *pvVar28;
  void *pvVar29;
  undefined8 *puVar30;
  undefined8 *puVar31;
  float *pfVar32;
  float *pfVar33;
  ChannelList *pCVar34;
  ChannelList *pCVar35;
  ulong uVar36;
  ulong *puVar37;
  long lVar38;
  ulong *puVar39;
  ulong *puVar40;
  undefined4 uVar41;
  uint uVar42;
  undefined4 in_register_0000000c;
  int iVar43;
  void *pvVar44;
  ulong uVar45;
  long lVar46;
  void *pvVar47;
  ulong uVar48;
  undefined4 in_register_00000084;
  ulong uVar49;
  undefined4 in_register_0000008c;
  uint uVar50;
  long lVar51;
  Array2D<Imath_3_2::half> *pAVar52;
  long lVar53;
  long lVar54;
  Array2D<Imath_3_2::half> *pAVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  int iVar68;
  long local_2a8;
  long local_2a0;
  Array2D<Imath_3_2::half> *local_298;
  ulong *local_290;
  ulong *local_288;
  TiledInputFile in2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_278;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_268;
  FrameBuffer fb;
  TiledInputFile in1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d0;
  FrameBuffer fb2;
  Header hdr;
  TiledOutputFile out;
  undefined8 uStack_150;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  Array2D<Imath_3_2::half> ph1;
  string filename2;
  string filename1;
  Array<Imf_3_4::Array2D<Imath_3_2::half>_> levels2;
  Array<Imf_3_4::Array2D<Imath_3_2::half>_> levels1;
  
  filename1._M_dataplus._M_p = (pointer)&filename1.field_2;
  pcVar2 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename1,pcVar2,pcVar2 + tempDir->_M_string_length,
             CONCAT44(in_register_0000000c,xs),CONCAT44(in_register_00000084,ys),
             CONCAT44(in_register_0000008c,dx));
  std::__cxx11::string::append((char *)&filename1);
  filename2._M_dataplus._M_p = (pointer)&filename2.field_2;
  pcVar2 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename2,pcVar2,pcVar2 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&filename2);
  _Var11 = w + 0xaa;
  iVar43 = h + 0x102;
  lVar18 = (long)-h;
  lVar19 = (long)-w;
  iVar17 = 0;
  do {
    uVar16 = 0;
    bVar8 = true;
    do {
      bVar9 = bVar8;
      _Var7._M_p = filename1._M_dataplus._M_p;
      _Var6._M_p = filename2._M_dataplus._M_p;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"levelMode 0, ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
      poVar20 = (ostream *)std::ostream::operator<<(&std::cout,iVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", roundingMode ",0xf);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", xOffset ",10);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,w);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", yOffset ",10);
      plVar21 = (long *)std::ostream::operator<<(poVar20,h);
      std::ios::widen((char)*(undefined8 *)(*plVar21 + -0x18) + (char)plVar21);
      std::ostream::put((char)plVar21);
      std::ostream::flush();
      _out = 0;
      fb2._map._M_t._M_impl._0_8_ = 0;
      fb._map._M_t._M_impl._0_4_ = w;
      fb._map._M_t._M_impl._4_4_ = h;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var11;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = iVar43;
      Imf_3_4::Header::Header
                (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&fb2,1.0,INCREASING_Y,ZIP_COMPRESSION);
      piVar22 = (int *)Imf_3_4::Header::compression();
      *piVar22 = iVar17;
      puVar23 = (undefined4 *)Imf_3_4::Header::lineOrder();
      *puVar23 = 0;
      pcVar24 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar24,(Channel *)0x1c529f);
      _out = 0x3700000011;
      uStack_150 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)uVar16 << 0x20);
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      ph1._sizeX = 0x103;
      ph1._sizeY = 0xab;
      phVar25 = (half *)operator_new__(0x15a02);
      ph1._data = phVar25;
      fillPixels(&ph1,0xab,0x103);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice
                ((Slice *)&out,HALF,(char *)(phVar25 + lVar18 * 0xab + lVar19),2,0x156,1,1,0.0,false
                 ,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c529f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
      std::ostream::flush();
      remove(_Var7._M_p);
      iVar12 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile(&out,_Var7._M_p,&hdr,iVar12);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar14 = (int)&out;
      iVar12 = Imf_3_4::TiledOutputFile::numXTiles(iVar14);
      iVar13 = Imf_3_4::TiledOutputFile::numYTiles(iVar14);
      Imf_3_4::TiledOutputFile::writeTiles(iVar14,0,iVar12 + -1,0,iVar13 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile(&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," copying",8);
      std::ostream::flush();
      remove(_Var6._M_p);
      iVar12 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&out,_Var7._M_p,iVar12);
      pHVar26 = (Header *)Imf_3_4::InputFile::header();
      iVar12 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&fb,_Var6._M_p,pHVar26,iVar12);
      Imf_3_4::TiledOutputFile::copyPixels((InputFile *)&fb);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fb);
      if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140);
      }
      if (uVar16 != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(uStack_150);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
      std::ostream::flush();
      iVar12 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile(&in1,_Var7._M_p,iVar12);
      iVar12 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile(&in2,_Var6._M_p,iVar12);
      Imf_3_4::TiledInputFile::header();
      piVar22 = (int *)Imf_3_4::Header::dataWindow();
      iVar12 = piVar22[2];
      lVar46 = (long)*piVar22;
      uVar36 = (iVar12 - lVar46) + 1;
      iVar13 = piVar22[1];
      iVar14 = piVar22[3] - iVar13;
      uVar50 = iVar14 + 1;
      lVar27 = (long)(int)uVar50 * uVar36;
      uVar45 = lVar27 * 2;
      if (lVar27 < 0) {
        uVar45 = 0xffffffffffffffff;
      }
      pvVar28 = operator_new__(uVar45);
      pvVar29 = operator_new__(uVar45);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb2._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      lVar27 = (long)-iVar13 * uVar36;
      uVar45 = uVar36 * 2;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice
                ((Slice *)&out,HALF,(char *)((long)pvVar28 + lVar46 * -2 + lVar27 * 2),2,uVar45,1,1,
                 0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c529f);
      Imf_3_4::Slice::Slice
                ((Slice *)&out,HALF,(char *)((long)pvVar29 + lVar46 * -2 + lVar27 * 2),2,uVar45,1,1,
                 0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb2,(Slice *)0x1c529f);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&in1);
      iVar13 = Imf_3_4::TiledInputFile::numXTiles((int)&in1);
      iVar15 = Imf_3_4::TiledInputFile::numYTiles((int)&in1);
      Imf_3_4::TiledInputFile::readTiles((int)&in1,0,iVar13 + -1,0,iVar15 + -1);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&in2);
      iVar13 = Imf_3_4::TiledInputFile::numXTiles((int)&in2);
      iVar15 = Imf_3_4::TiledInputFile::numYTiles((int)&in2);
      uVar41 = 0;
      Imf_3_4::TiledInputFile::readTiles((int)&in2,0,iVar13 + -1,0,iVar15 + -1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
      std::ostream::flush();
      Imf_3_4::TiledInputFile::header();
      puVar30 = (undefined8 *)Imf_3_4::Header::displayWindow();
      puVar31 = (undefined8 *)Imf_3_4::Header::displayWindow();
      iVar13 = -(uint)((int)*puVar31 == (int)*puVar30);
      iVar15 = -(uint)((int)((ulong)*puVar31 >> 0x20) == (int)((ulong)*puVar30 >> 0x20));
      auVar56._4_4_ = iVar13;
      auVar56._0_4_ = iVar13;
      auVar56._8_4_ = iVar15;
      auVar56._12_4_ = iVar15;
      iVar13 = movmskpd(uVar41,auVar56);
      if ((iVar13 != 3) ||
         (iVar15 = -(uint)((int)puVar31[1] == (int)puVar30[1]),
         iVar68 = -(uint)((int)((ulong)puVar31[1] >> 0x20) == (int)((ulong)puVar30[1] >> 0x20)),
         auVar57._4_4_ = iVar15, auVar57._0_4_ = iVar15, auVar57._8_4_ = iVar68,
         auVar57._12_4_ = iVar68, iVar15 = movmskpd((int)puVar31,auVar57), iVar15 != 3)) {
        __assert_fail("in2.header ().displayWindow () == hdr.displayWindow ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x8d,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      puVar30 = (undefined8 *)Imf_3_4::Header::dataWindow();
      puVar31 = (undefined8 *)Imf_3_4::Header::dataWindow();
      iVar15 = -(uint)((int)*puVar31 == (int)*puVar30);
      iVar68 = -(uint)((int)((ulong)*puVar31 >> 0x20) == (int)((ulong)*puVar30 >> 0x20));
      auVar58._4_4_ = iVar15;
      auVar58._0_4_ = iVar15;
      auVar58._8_4_ = iVar68;
      auVar58._12_4_ = iVar68;
      iVar13 = movmskpd(iVar13,auVar58);
      if ((iVar13 != 3) ||
         (iVar13 = -(uint)((int)puVar31[1] == (int)puVar30[1]),
         iVar15 = -(uint)((int)((ulong)puVar31[1] >> 0x20) == (int)((ulong)puVar30[1] >> 0x20)),
         auVar59._4_4_ = iVar13, auVar59._0_4_ = iVar13, auVar59._8_4_ = iVar15,
         auVar59._12_4_ = iVar15, iVar13 = movmskpd((int)puVar31,auVar59), iVar13 != 3)) {
        __assert_fail("in2.header ().dataWindow () == hdr.dataWindow ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x8e,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pfVar32 = (float *)Imf_3_4::Header::pixelAspectRatio();
      fVar1 = *pfVar32;
      pfVar32 = (float *)Imf_3_4::Header::pixelAspectRatio();
      if ((fVar1 != *pfVar32) || (NAN(fVar1) || NAN(*pfVar32))) {
        __assert_fail("in2.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x8f,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pfVar32 = (float *)Imf_3_4::Header::screenWindowCenter();
      pfVar33 = (float *)Imf_3_4::Header::screenWindowCenter();
      if ((((*pfVar32 != *pfVar33) || (NAN(*pfVar32) || NAN(*pfVar33))) ||
          (pfVar32[1] != pfVar33[1])) || (NAN(pfVar32[1]) || NAN(pfVar33[1]))) {
        __assert_fail("in2.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x91,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pfVar32 = (float *)Imf_3_4::Header::screenWindowWidth();
      fVar1 = *pfVar32;
      pfVar32 = (float *)Imf_3_4::Header::screenWindowWidth();
      if ((fVar1 != *pfVar32) || (NAN(fVar1) || NAN(*pfVar32))) {
        __assert_fail("in2.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x92,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      piVar22 = (int *)Imf_3_4::Header::lineOrder();
      iVar13 = *piVar22;
      piVar22 = (int *)Imf_3_4::Header::lineOrder();
      if (iVar13 != *piVar22) {
        __assert_fail("in2.header ().lineOrder () == hdr.lineOrder ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x93,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      piVar22 = (int *)Imf_3_4::Header::compression();
      iVar13 = *piVar22;
      piVar22 = (int *)Imf_3_4::Header::compression();
      if (iVar13 != *piVar22) {
        __assert_fail("in2.header ().compression () == hdr.compression ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x94,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pCVar34 = (ChannelList *)Imf_3_4::Header::channels();
      pCVar35 = (ChannelList *)Imf_3_4::Header::channels();
      cVar10 = Imf_3_4::ChannelList::operator==(pCVar34,pCVar35);
      if (cVar10 == '\0') {
        __assert_fail("in2.header ().channels () == hdr.channels ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x95,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      if (-1 < iVar14) {
        uVar48 = 0;
        pvVar44 = pvVar28;
        pvVar47 = pvVar29;
        do {
          if (-1 < (int)(iVar12 - lVar46)) {
            uVar49 = 0;
            do {
              fVar1 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)((long)pvVar44 + uVar49 * 2) * 4);
              pfVar32 = (float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)((long)pvVar47 + uVar49 * 2) * 4);
              if ((fVar1 != *pfVar32) || (NAN(fVar1) || NAN(*pfVar32))) {
                __assert_fail("ph1[y][x] == ph2[y][x]",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                              ,0x99,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                             );
              }
              uVar49 = uVar49 + 1;
            } while ((uVar36 & 0xffffffff) != uVar49);
          }
          uVar48 = uVar48 + 1;
          pvVar47 = (void *)((long)pvVar47 + uVar45);
          pvVar44 = (void *)((long)pvVar44 + uVar45);
        } while (uVar48 != uVar50);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb2);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      operator_delete__(pvVar29);
      operator_delete__(pvVar28);
      if (local_268 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_268);
      }
      if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
      }
      if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0);
      }
      if (local_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0);
      }
      remove(_Var7._M_p);
      remove(_Var6._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      operator_delete__(phVar25);
      Imf_3_4::Header::~Header(&hdr);
      _Var7 = filename1._M_dataplus;
      _Var6 = filename2._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"levelMode 1, ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
      poVar20 = (ostream *)std::ostream::operator<<(&std::cout,iVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", roundingMode ",0xf);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", xOffset ",10);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,w);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", yOffset ",10);
      plVar21 = (long *)std::ostream::operator<<(poVar20,h);
      std::ios::widen((char)*(undefined8 *)(*plVar21 + -0x18) + (char)plVar21);
      std::ostream::put((char)plVar21);
      std::ostream::flush();
      _out = 0;
      fb2._map._M_t._M_impl._0_8_ = 0;
      fb._map._M_t._M_impl._0_4_ = w;
      fb._map._M_t._M_impl._4_4_ = h;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var11;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = iVar43;
      Imf_3_4::Header::Header
                (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&fb2,1.0,INCREASING_Y,ZIP_COMPRESSION);
      piVar22 = (int *)Imf_3_4::Header::compression();
      *piVar22 = iVar17;
      puVar23 = (undefined4 *)Imf_3_4::Header::lineOrder();
      *puVar23 = 0;
      pcVar24 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar24,(Channel *)0x1c529f);
      _out = 0x3700000011;
      uStack_150 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uVar16,1);
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      ph1._sizeX = 0;
      ph1._sizeY = 0;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
      std::ostream::flush();
      remove(_Var7._M_p);
      iVar12 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&fb2,_Var7._M_p,&hdr,iVar12);
      iVar12 = Imf_3_4::TiledOutputFile::numLevels();
      uVar45 = (ulong)iVar12;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar45;
      uVar36 = SUB168(auVar3 * ZEXT816(0x18),0);
      uVar48 = uVar36 + 8;
      if (0xfffffffffffffff7 < uVar36) {
        uVar48 = 0xffffffffffffffff;
      }
      if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
        uVar48 = 0xffffffffffffffff;
      }
      puVar37 = (ulong *)operator_new__(uVar48);
      *puVar37 = uVar45;
      if (iVar12 != 0) {
        memset(puVar37 + 1,0,((uVar36 - 0x18) / 0x18) * 0x18 + 0x18);
      }
      if (ph1._sizeY != 0) {
        lVar27 = *(long *)(ph1._sizeY + -8);
        pvVar28 = (void *)(ph1._sizeY + -8);
        if (lVar27 != 0) {
          lVar46 = lVar27 * 0x18;
          do {
            pvVar29 = *(void **)((long)pvVar28 + lVar46);
            if (pvVar29 != (void *)0x0) {
              operator_delete__(pvVar29);
            }
            lVar46 = lVar46 + -0x18;
          } while (lVar46 != 0);
        }
        operator_delete__(pvVar28,lVar27 * 0x18 + 8);
      }
      lVar27 = 0;
      local_2a8 = 0;
      ph1._sizeX = uVar45;
      ph1._sizeY = (long)(puVar37 + 1);
      while( true ) {
        iVar12 = Imf_3_4::TiledOutputFile::numLevels();
        if (iVar12 <= local_2a8) break;
        iVar13 = (int)(TiledOutputFile *)&fb2;
        iVar12 = Imf_3_4::TiledOutputFile::levelWidth(iVar13);
        iVar13 = Imf_3_4::TiledOutputFile::levelHeight(iVar13);
        lVar46 = ph1._sizeY;
        lVar51 = (long)iVar12;
        lVar38 = iVar13 * lVar51;
        uVar36 = lVar38 * 2;
        if (lVar38 < 0) {
          uVar36 = 0xffffffffffffffff;
        }
        pvVar29 = operator_new__(uVar36);
        pvVar28 = *(void **)(lVar46 + 0x10 + lVar27);
        lVar38 = lVar46;
        if (pvVar28 != (void *)0x0) {
          operator_delete__(pvVar28);
          lVar38 = ph1._sizeY;
        }
        *(long *)(lVar46 + lVar27) = (long)iVar13;
        *(long *)(lVar46 + 8 + lVar27) = lVar51;
        *(void **)(lVar46 + 0x10 + lVar27) = pvVar29;
        fillPixels((Array2D<Imath_3_2::half> *)(lVar38 + lVar27),iVar12,iVar13);
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        Imf_3_4::Slice::Slice
                  ((Slice *)&out,HALF,
                   (char *)(*(long *)(ph1._sizeY + 8 + lVar27) * lVar18 * 2 +
                            *(long *)(ph1._sizeY + 0x10 + lVar27) + lVar19 * 2),2,lVar51 * 2,1,1,0.0
                   ,false,false);
        Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c529f);
        Imf_3_4::TiledOutputFile::setFrameBuffer(&fb2);
        iVar14 = (int)&fb2;
        iVar12 = Imf_3_4::TiledOutputFile::numXTiles(iVar14);
        iVar13 = Imf_3_4::TiledOutputFile::numYTiles(iVar14);
        Imf_3_4::TiledOutputFile::writeTiles(iVar14,0,iVar12 + -1,0,iVar13 + -1);
        std::
        _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                     *)&fb);
        local_2a8 = local_2a8 + 1;
        lVar27 = lVar27 + 0x18;
      }
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fb2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," copying",8);
      std::ostream::flush();
      remove(_Var6._M_p);
      iVar12 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&out,_Var7._M_p,iVar12);
      pHVar26 = (Header *)Imf_3_4::InputFile::header();
      iVar12 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&fb,_Var6._M_p,pHVar26,iVar12);
      Imf_3_4::TiledOutputFile::copyPixels((InputFile *)&fb);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fb);
      if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140);
      }
      if (uStack_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(uStack_150);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
      std::ostream::flush();
      iVar12 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile(&in1,_Var7._M_p,iVar12);
      iVar12 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile(&in2,_Var6._M_p,iVar12);
      Imf_3_4::TiledInputFile::header();
      piVar22 = (int *)Imf_3_4::Header::dataWindow();
      lVar46 = (long)*piVar22;
      iVar12 = piVar22[1];
      lVar27 = lVar46;
      uVar50 = Imf_3_4::TiledInputFile::numLevels();
      uVar41 = (undefined4)lVar27;
      Imf_3_4::Array<Imf_3_4::Array2D<Imath_3_2::half>_>::Array(&levels1,(long)(int)uVar50);
      Imf_3_4::Array<Imf_3_4::Array2D<Imath_3_2::half>_>::Array(&levels2,(long)(int)uVar50);
      if (0 < (int)uVar50) {
        lVar27 = 0x10;
        uVar36 = 0;
        do {
          iVar13 = Imf_3_4::TiledInputFile::levelWidth((int)&in2);
          iVar14 = Imf_3_4::TiledInputFile::levelHeight((int)&in2);
          pAVar55 = levels1._data;
          lVar51 = (long)iVar14;
          lVar38 = (long)iVar13;
          uVar45 = lVar51 * lVar38 * 2;
          if (lVar51 * lVar38 < 0) {
            uVar45 = 0xffffffffffffffff;
          }
          pvVar29 = operator_new__(uVar45);
          pvVar28 = *(void **)((long)&pAVar55->_sizeX + lVar27);
          if (pvVar28 != (void *)0x0) {
            operator_delete__(pvVar28);
          }
          pAVar52 = levels2._data;
          *(long *)((long)pAVar55 + lVar27 + -0x10) = lVar51;
          *(long *)((long)pAVar55 + lVar27 + -8) = lVar38;
          *(void **)((long)&pAVar55->_sizeX + lVar27) = pvVar29;
          pvVar29 = operator_new__(uVar45);
          pvVar28 = *(void **)((long)&pAVar52->_sizeX + lVar27);
          if (pvVar28 != (void *)0x0) {
            operator_delete__(pvVar28);
          }
          *(long *)((long)pAVar52 + lVar27 + -0x10) = lVar51;
          *(long *)((long)pAVar52 + lVar27 + -8) = lVar38;
          *(void **)((long)&pAVar52->_sizeX + lVar27) = pvVar29;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &fb2._map._M_t._M_impl.super__Rb_tree_header._M_header;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          Imf_3_4::Slice::Slice
                    ((Slice *)&out,HALF,
                     (char *)(*(long *)((long)levels1._data + lVar27 + -8) * -(long)iVar12 * 2 +
                              *(long *)((long)&(levels1._data)->_sizeX + lVar27) + lVar46 * -2),2,
                     lVar38 * 2,1,1,0.0,false,false);
          Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c529f);
          Imf_3_4::Slice::Slice
                    ((Slice *)&out,HALF,
                     (char *)(*(long *)((long)levels2._data + lVar27 + -8) * -(long)iVar12 * 2 +
                              *(long *)((long)&(levels2._data)->_sizeX + lVar27) + lVar46 * -2),2,
                     lVar38 * 2,1,1,0.0,false,false);
          Imf_3_4::FrameBuffer::insert((char *)&fb2,(Slice *)0x1c529f);
          Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&in1);
          Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&in2);
          iVar13 = Imf_3_4::TiledInputFile::numXTiles((int)&in1);
          iVar14 = Imf_3_4::TiledInputFile::numYTiles((int)&in1);
          Imf_3_4::TiledInputFile::readTiles((int)&in1,0,iVar13 + -1,0,iVar14 + -1);
          iVar13 = Imf_3_4::TiledInputFile::numXTiles((int)&in2);
          iVar14 = Imf_3_4::TiledInputFile::numYTiles((int)&in2);
          uVar41 = 0;
          Imf_3_4::TiledInputFile::readTiles((int)&in2,0,iVar13 + -1,0,iVar14 + -1);
          std::
          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                       *)&fb2);
          std::
          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                       *)&fb);
          uVar36 = uVar36 + 1;
          lVar27 = lVar27 + 0x18;
        } while (uVar50 != uVar36);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
      std::ostream::flush();
      Imf_3_4::TiledInputFile::header();
      puVar30 = (undefined8 *)Imf_3_4::Header::displayWindow();
      puVar31 = (undefined8 *)Imf_3_4::Header::displayWindow();
      iVar12 = -(uint)((int)*puVar31 == (int)*puVar30);
      iVar13 = -(uint)((int)((ulong)*puVar31 >> 0x20) == (int)((ulong)*puVar30 >> 0x20));
      auVar60._4_4_ = iVar12;
      auVar60._0_4_ = iVar12;
      auVar60._8_4_ = iVar13;
      auVar60._12_4_ = iVar13;
      iVar12 = movmskpd(uVar41,auVar60);
      if ((iVar12 != 3) ||
         (iVar13 = -(uint)((int)puVar31[1] == (int)puVar30[1]),
         iVar14 = -(uint)((int)((ulong)puVar31[1] >> 0x20) == (int)((ulong)puVar30[1] >> 0x20)),
         auVar61._4_4_ = iVar13, auVar61._0_4_ = iVar13, auVar61._8_4_ = iVar14,
         auVar61._12_4_ = iVar14, iVar13 = movmskpd((int)puVar31,auVar61), iVar13 != 3)) {
        __assert_fail("in2.header ().displayWindow () == hdr.displayWindow ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,300,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      puVar30 = (undefined8 *)Imf_3_4::Header::dataWindow();
      puVar31 = (undefined8 *)Imf_3_4::Header::dataWindow();
      iVar13 = -(uint)((int)*puVar31 == (int)*puVar30);
      iVar14 = -(uint)((int)((ulong)*puVar31 >> 0x20) == (int)((ulong)*puVar30 >> 0x20));
      auVar62._4_4_ = iVar13;
      auVar62._0_4_ = iVar13;
      auVar62._8_4_ = iVar14;
      auVar62._12_4_ = iVar14;
      iVar12 = movmskpd(iVar12,auVar62);
      if ((iVar12 != 3) ||
         (iVar12 = -(uint)((int)puVar31[1] == (int)puVar30[1]),
         iVar13 = -(uint)((int)((ulong)puVar31[1] >> 0x20) == (int)((ulong)puVar30[1] >> 0x20)),
         auVar63._4_4_ = iVar12, auVar63._0_4_ = iVar12, auVar63._8_4_ = iVar13,
         auVar63._12_4_ = iVar13, iVar12 = movmskpd((int)puVar31,auVar63), iVar12 != 3)) {
        __assert_fail("in2.header ().dataWindow () == hdr.dataWindow ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x12d,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pfVar32 = (float *)Imf_3_4::Header::pixelAspectRatio();
      fVar1 = *pfVar32;
      pfVar32 = (float *)Imf_3_4::Header::pixelAspectRatio();
      if ((fVar1 != *pfVar32) || (NAN(fVar1) || NAN(*pfVar32))) {
        __assert_fail("in2.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x12e,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pfVar32 = (float *)Imf_3_4::Header::screenWindowCenter();
      pfVar33 = (float *)Imf_3_4::Header::screenWindowCenter();
      if ((((*pfVar32 != *pfVar33) || (NAN(*pfVar32) || NAN(*pfVar33))) ||
          (pfVar32[1] != pfVar33[1])) || (NAN(pfVar32[1]) || NAN(pfVar33[1]))) {
        __assert_fail("in2.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x130,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pfVar32 = (float *)Imf_3_4::Header::screenWindowWidth();
      fVar1 = *pfVar32;
      pfVar32 = (float *)Imf_3_4::Header::screenWindowWidth();
      if ((fVar1 != *pfVar32) || (NAN(fVar1) || NAN(*pfVar32))) {
        __assert_fail("in2.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x131,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      piVar22 = (int *)Imf_3_4::Header::lineOrder();
      iVar12 = *piVar22;
      piVar22 = (int *)Imf_3_4::Header::lineOrder();
      if (iVar12 != *piVar22) {
        __assert_fail("in2.header ().lineOrder () == hdr.lineOrder ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x132,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      piVar22 = (int *)Imf_3_4::Header::compression();
      iVar12 = *piVar22;
      piVar22 = (int *)Imf_3_4::Header::compression();
      if (iVar12 != *piVar22) {
        __assert_fail("in2.header ().compression () == hdr.compression ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x133,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pCVar34 = (ChannelList *)Imf_3_4::Header::channels();
      pCVar35 = (ChannelList *)Imf_3_4::Header::channels();
      cVar10 = Imf_3_4::ChannelList::operator==(pCVar34,pCVar35);
      if (cVar10 == '\0') {
        __assert_fail("in2.header ().channels () == hdr.channels ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x134,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      if (0 < (int)uVar50) {
        uVar36 = 0;
        do {
          lVar46 = 0;
          lVar27 = 0;
          while( true ) {
            iVar12 = Imf_3_4::TiledInputFile::levelHeight((int)&in1);
            if (iVar12 <= lVar27) break;
            lVar38 = 0;
            while( true ) {
              iVar12 = Imf_3_4::TiledInputFile::levelWidth((int)&in1);
              if (iVar12 <= lVar38) break;
              fVar1 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(uint16_t *)
                                        ((long)&levels2._data[uVar36]._data[lVar38]._h +
                                        levels2._data[uVar36]._sizeY * lVar46) * 4);
              pfVar32 = (float *)(_imath_half_to_float_table +
                                 (ulong)*(uint16_t *)
                                         ((long)&levels1._data[uVar36]._data[lVar38]._h +
                                         levels1._data[uVar36]._sizeY * lVar46) * 4);
              if ((fVar1 != *pfVar32) || (NAN(fVar1) || NAN(*pfVar32))) {
                __assert_fail("(levels2[l])[y][x] == (levels1[l])[y][x]",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                              ,0x13a,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                             );
              }
              if ((iVar17 - 8U < 0xfffffffe) &&
                 ((pfVar32 = (float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)
                                              (*(long *)(ph1._sizeY + 8 + uVar36 * 0x18) * lVar46 +
                                               *(long *)(ph1._sizeY + 0x10 + uVar36 * 0x18) +
                                              lVar38 * 2) * 4), fVar1 != *pfVar32 ||
                  (NAN(fVar1) || NAN(*pfVar32))))) {
                __assert_fail("(levels2[l])[y][x] == (levels[l])[y][x]",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                              ,0x13d,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                             );
              }
              lVar38 = lVar38 + 1;
            }
            lVar27 = lVar27 + 1;
            lVar46 = lVar46 + 2;
          }
          uVar36 = uVar36 + 1;
        } while (uVar36 != uVar50);
      }
      Imf_3_4::Array<Imf_3_4::Array2D<Imath_3_2::half>_>::~Array(&levels2);
      Imf_3_4::Array<Imf_3_4::Array2D<Imath_3_2::half>_>::~Array(&levels1);
      if (local_268 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_268);
      }
      if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
      }
      if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0);
      }
      if (local_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0);
      }
      remove(_Var7._M_p);
      remove(_Var6._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      Imf_3_4::Array<Imf_3_4::Array2D<Imath_3_2::half>_>::~Array
                ((Array<Imf_3_4::Array2D<Imath_3_2::half>_> *)&ph1);
      Imf_3_4::Header::~Header(&hdr);
      _Var7 = filename1._M_dataplus;
      _Var6 = filename2._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"levelMode 2, ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
      poVar20 = (ostream *)std::ostream::operator<<(&std::cout,iVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", roundingMode ",0xf);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", xOffset ",10);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,w);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", yOffset ",10);
      plVar21 = (long *)std::ostream::operator<<(poVar20,h);
      std::ios::widen((char)*(undefined8 *)(*plVar21 + -0x18) + (char)plVar21);
      std::ostream::put((char)plVar21);
      std::ostream::flush();
      _out = 0;
      fb2._map._M_t._M_impl._0_8_ = 0;
      fb._map._M_t._M_impl._0_4_ = w;
      fb._map._M_t._M_impl._4_4_ = h;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var11;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = iVar43;
      Imf_3_4::Header::Header
                (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&fb2,1.0,INCREASING_Y,ZIP_COMPRESSION);
      piVar22 = (int *)Imf_3_4::Header::compression();
      *piVar22 = iVar17;
      puVar23 = (undefined4 *)Imf_3_4::Header::lineOrder();
      *puVar23 = 0;
      pcVar24 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar24,(Channel *)0x1c529f);
      _out = 0x3700000011;
      uStack_150 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uVar16,2);
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
      std::ostream::flush();
      remove(_Var7._M_p);
      iVar12 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&fb2,_Var7._M_p,&hdr,iVar12);
      iVar12 = Imf_3_4::TiledOutputFile::numYLevels();
      iVar13 = Imf_3_4::TiledOutputFile::numXLevels();
      lVar27 = (long)iVar13;
      uVar45 = iVar12 * lVar27;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar45;
      uVar36 = SUB168(auVar4 * ZEXT816(0x18),0);
      uVar48 = uVar36 + 8;
      if (0xfffffffffffffff7 < uVar36) {
        uVar48 = 0xffffffffffffffff;
      }
      if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
        uVar48 = 0xffffffffffffffff;
      }
      puVar37 = (ulong *)operator_new__(uVar48);
      *puVar37 = uVar45;
      pAVar55 = (Array2D<Imath_3_2::half> *)(puVar37 + 1);
      if (uVar45 != 0) {
        memset(pAVar55,0,((uVar36 - 0x18) / 0x18) * 0x18 + 0x18);
      }
      local_2a8 = 0;
      local_298 = pAVar55;
      while( true ) {
        iVar12 = Imf_3_4::TiledOutputFile::numYLevels();
        if (iVar12 <= local_2a8) break;
        lVar46 = 0;
        pAVar52 = local_298;
        while( true ) {
          iVar12 = Imf_3_4::TiledOutputFile::numXLevels();
          if (iVar12 <= lVar46) break;
          iVar12 = Imf_3_4::TiledOutputFile::levelWidth((int)&fb2);
          iVar13 = Imf_3_4::TiledOutputFile::levelHeight((int)&fb2);
          lVar51 = (long)iVar12;
          lVar38 = iVar13 * lVar51;
          uVar36 = lVar38 * 2;
          if (lVar38 < 0) {
            uVar36 = 0xffffffffffffffff;
          }
          phVar25 = (half *)operator_new__(uVar36);
          if (pAVar52->_data != (half *)0x0) {
            operator_delete__(pAVar52->_data);
          }
          pAVar52->_sizeX = (long)iVar13;
          pAVar52->_sizeY = lVar51;
          pAVar52->_data = phVar25;
          fillPixels(pAVar52,iVar12,iVar13);
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          Imf_3_4::Slice::Slice
                    ((Slice *)&out,HALF,(char *)(pAVar52->_data + pAVar52->_sizeY * lVar18 + lVar19)
                     ,2,lVar51 * 2,1,1,0.0,false,false);
          Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c529f);
          Imf_3_4::TiledOutputFile::setFrameBuffer(&fb2);
          iVar14 = (int)&fb2;
          iVar12 = Imf_3_4::TiledOutputFile::numXTiles(iVar14);
          iVar13 = Imf_3_4::TiledOutputFile::numYTiles(iVar14);
          Imf_3_4::TiledOutputFile::writeTiles(iVar14,0,iVar12 + -1,0,iVar13 + -1,(int)lVar46);
          std::
          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                       *)&fb);
          lVar46 = lVar46 + 1;
          pAVar52 = pAVar52 + 1;
        }
        local_2a8 = local_2a8 + 1;
        local_298 = local_298 + lVar27;
      }
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fb2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," copying",8);
      std::ostream::flush();
      remove(_Var6._M_p);
      iVar12 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&out,_Var7._M_p,iVar12);
      pHVar26 = (Header *)Imf_3_4::InputFile::header();
      iVar12 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&fb,_Var6._M_p,pHVar26,iVar12);
      Imf_3_4::TiledOutputFile::copyPixels((InputFile *)&fb);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fb);
      if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140);
      }
      if (uStack_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(uStack_150);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
      std::ostream::flush();
      iVar12 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile(&in1,_Var7._M_p,iVar12);
      iVar12 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile(&in2,_Var6._M_p,iVar12);
      Imf_3_4::TiledInputFile::header();
      piVar22 = (int *)Imf_3_4::Header::dataWindow();
      iVar12 = *piVar22;
      iVar13 = piVar22[1];
      uVar16 = Imf_3_4::TiledInputFile::numXLevels();
      uVar50 = Imf_3_4::TiledInputFile::numYLevels();
      lVar46 = (long)(int)uVar16;
      uVar45 = (int)uVar50 * lVar46;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar45;
      uVar36 = SUB168(auVar5 * ZEXT816(0x18),0);
      uVar48 = uVar36 + 8;
      if (0xfffffffffffffff7 < uVar36) {
        uVar48 = 0xffffffffffffffff;
      }
      if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
        uVar48 = 0xffffffffffffffff;
      }
      puVar39 = (ulong *)operator_new__(uVar48);
      *puVar39 = uVar45;
      __s = puVar39 + 1;
      if (uVar45 != 0) {
        memset(__s,0,((uVar36 - 0x18) / 0x18) * 0x18 + 0x18);
      }
      puVar40 = (ulong *)operator_new__(uVar48);
      __s_00 = puVar40 + 1;
      *puVar40 = uVar45;
      if (uVar45 != 0) {
        memset(__s_00,0,((uVar36 - 0x18) / 0x18) * 0x18 + 0x18);
      }
      uVar36 = (ulong)uVar50;
      uVar42 = uVar50;
      if (0 < (int)uVar50) {
        local_288 = puVar40 + 3;
        local_290 = puVar39 + 3;
        uVar48 = 0;
        uVar45 = uVar36;
        do {
          if (0 < (int)uVar16) {
            local_2a0 = 0;
            uVar49 = 0;
            do {
              iVar14 = Imf_3_4::TiledInputFile::levelWidth((int)&in2);
              iVar15 = Imf_3_4::TiledInputFile::levelHeight((int)&in2);
              lVar51 = (long)iVar15;
              lVar38 = (long)iVar14;
              uVar45 = lVar51 * lVar38 * 2;
              if (lVar51 * lVar38 < 0) {
                uVar45 = 0xffffffffffffffff;
              }
              pvVar28 = operator_new__(uVar45);
              if (*(void **)((long)local_290 + local_2a0) != (void *)0x0) {
                operator_delete__(*(void **)((long)local_290 + local_2a0));
              }
              *(long *)((long)local_290 + local_2a0 + -0x10) = lVar51;
              *(long *)((long)local_290 + local_2a0 + -8) = lVar38;
              *(void **)((long)local_290 + local_2a0) = pvVar28;
              pvVar29 = operator_new__(uVar45);
              lVar54 = lVar38;
              if (*(void **)((long)local_288 + local_2a0) != (void *)0x0) {
                operator_delete__(*(void **)((long)local_288 + local_2a0));
                lVar54 = *(long *)((long)local_290 + local_2a0 + -8);
                pvVar28 = *(void **)((long)local_290 + local_2a0);
              }
              *(long *)((long)local_288 + local_2a0 + -0x10) = lVar51;
              *(long *)((long)local_288 + local_2a0 + -8) = lVar38;
              *(void **)((long)local_288 + local_2a0) = pvVar29;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &fb2._map._M_t._M_impl.super__Rb_tree_header._M_header;
              fb2._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              Imf_3_4::Slice::Slice
                        ((Slice *)&out,HALF,
                         (char *)((long)pvVar28 + (long)iVar12 * -2 + lVar54 * -(long)iVar13 * 2),2,
                         lVar38 * 2,1,1,0.0,false,false);
              Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c529f);
              Imf_3_4::Slice::Slice
                        ((Slice *)&out,HALF,
                         (char *)(*(long *)((long)local_288 + local_2a0 + -8) * -(long)iVar13 * 2 +
                                  *(long *)((long)local_288 + local_2a0) + (long)iVar12 * -2),2,
                         lVar38 * 2,1,1,0.0,false,false);
              Imf_3_4::FrameBuffer::insert((char *)&fb2,(Slice *)0x1c529f);
              Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&in1);
              Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&in2);
              iVar14 = Imf_3_4::TiledInputFile::numXTiles((int)&in1);
              iVar15 = Imf_3_4::TiledInputFile::numYTiles((int)&in1);
              Imf_3_4::TiledInputFile::readTiles((int)&in1,0,iVar14 + -1,0,iVar15 + -1,(int)uVar49);
              iVar14 = Imf_3_4::TiledInputFile::numXTiles((int)&in2);
              iVar15 = Imf_3_4::TiledInputFile::numYTiles((int)&in2);
              uVar45 = 0;
              Imf_3_4::TiledInputFile::readTiles((int)&in2,0,iVar14 + -1,0,iVar15 + -1,(int)uVar49);
              std::
              _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                           *)&fb2);
              std::
              _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                           *)&fb);
              uVar49 = uVar49 + 1;
              local_2a0 = local_2a0 + 0x18;
            } while (uVar16 != uVar49);
          }
          uVar42 = (uint)uVar45;
          uVar48 = uVar48 + 1;
          local_288 = local_288 + lVar46 * 3;
          local_290 = local_290 + lVar46 * 3;
        } while (uVar48 != uVar36);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
      std::ostream::flush();
      Imf_3_4::TiledInputFile::header();
      puVar30 = (undefined8 *)Imf_3_4::Header::displayWindow();
      puVar31 = (undefined8 *)Imf_3_4::Header::displayWindow();
      iVar12 = -(uint)((int)*puVar31 == (int)*puVar30);
      iVar13 = -(uint)((int)((ulong)*puVar31 >> 0x20) == (int)((ulong)*puVar30 >> 0x20));
      auVar64._4_4_ = iVar12;
      auVar64._0_4_ = iVar12;
      auVar64._8_4_ = iVar13;
      auVar64._12_4_ = iVar13;
      iVar12 = movmskpd(uVar42,auVar64);
      if ((iVar12 != 3) ||
         (iVar13 = -(uint)((int)puVar31[1] == (int)puVar30[1]),
         iVar14 = -(uint)((int)((ulong)puVar31[1] >> 0x20) == (int)((ulong)puVar30[1] >> 0x20)),
         auVar65._4_4_ = iVar13, auVar65._0_4_ = iVar13, auVar65._8_4_ = iVar14,
         auVar65._12_4_ = iVar14, iVar13 = movmskpd((int)puVar31,auVar65), iVar13 != 3)) {
        __assert_fail("in2.header ().displayWindow () == hdr.displayWindow ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1da,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      puVar30 = (undefined8 *)Imf_3_4::Header::dataWindow();
      puVar31 = (undefined8 *)Imf_3_4::Header::dataWindow();
      iVar13 = -(uint)((int)*puVar31 == (int)*puVar30);
      iVar14 = -(uint)((int)((ulong)*puVar31 >> 0x20) == (int)((ulong)*puVar30 >> 0x20));
      auVar66._4_4_ = iVar13;
      auVar66._0_4_ = iVar13;
      auVar66._8_4_ = iVar14;
      auVar66._12_4_ = iVar14;
      iVar12 = movmskpd(iVar12,auVar66);
      if ((iVar12 != 3) ||
         (iVar12 = -(uint)((int)puVar31[1] == (int)puVar30[1]),
         iVar13 = -(uint)((int)((ulong)puVar31[1] >> 0x20) == (int)((ulong)puVar30[1] >> 0x20)),
         auVar67._4_4_ = iVar12, auVar67._0_4_ = iVar12, auVar67._8_4_ = iVar13,
         auVar67._12_4_ = iVar13, iVar12 = movmskpd((int)puVar31,auVar67), iVar12 != 3)) {
        __assert_fail("in2.header ().dataWindow () == hdr.dataWindow ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1db,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pfVar32 = (float *)Imf_3_4::Header::pixelAspectRatio();
      fVar1 = *pfVar32;
      pfVar32 = (float *)Imf_3_4::Header::pixelAspectRatio();
      if ((fVar1 != *pfVar32) || (NAN(fVar1) || NAN(*pfVar32))) {
        __assert_fail("in2.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1dc,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pfVar32 = (float *)Imf_3_4::Header::screenWindowCenter();
      pfVar33 = (float *)Imf_3_4::Header::screenWindowCenter();
      if ((((*pfVar32 != *pfVar33) || (NAN(*pfVar32) || NAN(*pfVar33))) ||
          (pfVar32[1] != pfVar33[1])) || (NAN(pfVar32[1]) || NAN(pfVar33[1]))) {
        __assert_fail("in2.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1de,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pfVar32 = (float *)Imf_3_4::Header::screenWindowWidth();
      fVar1 = *pfVar32;
      pfVar32 = (float *)Imf_3_4::Header::screenWindowWidth();
      if ((fVar1 != *pfVar32) || (NAN(fVar1) || NAN(*pfVar32))) {
        __assert_fail("in2.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1df,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      piVar22 = (int *)Imf_3_4::Header::lineOrder();
      iVar12 = *piVar22;
      piVar22 = (int *)Imf_3_4::Header::lineOrder();
      if (iVar12 != *piVar22) {
        __assert_fail("in2.header ().lineOrder () == hdr.lineOrder ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1e0,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      piVar22 = (int *)Imf_3_4::Header::compression();
      iVar12 = *piVar22;
      piVar22 = (int *)Imf_3_4::Header::compression();
      if (iVar12 != *piVar22) {
        __assert_fail("in2.header ().compression () == hdr.compression ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1e1,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_4::TiledInputFile::header();
      pCVar34 = (ChannelList *)Imf_3_4::Header::channels();
      pCVar35 = (ChannelList *)Imf_3_4::Header::channels();
      cVar10 = Imf_3_4::ChannelList::operator==(pCVar34,pCVar35);
      if (cVar10 == '\0') {
        __assert_fail("in2.header ().channels () == hdr.channels ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1e2,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      if (0 < (int)uVar50) {
        local_288 = (ulong *)0x0;
        do {
          if (0 < (int)uVar16) {
            lVar38 = (long)local_288 * lVar46;
            uVar45 = 0;
            do {
              lVar51 = 0;
              lVar54 = 0;
              while( true ) {
                iVar12 = Imf_3_4::TiledInputFile::levelHeight((int)&in1);
                if (iVar12 <= lVar54) break;
                lVar53 = 0;
                while( true ) {
                  iVar12 = Imf_3_4::TiledInputFile::levelWidth((int)&in1);
                  if (iVar12 <= lVar53) break;
                  fVar1 = *(float *)(_imath_half_to_float_table +
                                    (ulong)*(ushort *)
                                            (__s_00[lVar38 * 3 + uVar45 * 3 + 1] * lVar51 +
                                             __s_00[lVar38 * 3 + uVar45 * 3 + 2] + lVar53 * 2) * 4);
                  pfVar32 = (float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)
                                             (__s[lVar38 * 3 + uVar45 * 3 + 1] * lVar51 +
                                              __s[lVar38 * 3 + uVar45 * 3 + 2] + lVar53 * 2) * 4);
                  if ((fVar1 != *pfVar32) || (NAN(fVar1) || NAN(*pfVar32))) {
                    __assert_fail("(levels2[ly][lx])[y][x] == (levels1[ly][lx])[y][x]",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                                  ,0x1ea,
                                  "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                                 );
                  }
                  if ((iVar17 - 8U < 0xfffffffe) &&
                     ((pfVar32 = (float *)(_imath_half_to_float_table +
                                          (ulong)*(uint16_t *)
                                                  ((long)&pAVar55[(long)local_288 * lVar27 + uVar45]
                                                          ._data[lVar53]._h +
                                                  pAVar55[(long)local_288 * lVar27 + uVar45]._sizeY
                                                  * lVar51) * 4), fVar1 != *pfVar32 ||
                      (NAN(fVar1) || NAN(*pfVar32))))) {
                    __assert_fail("(levels2[ly][lx])[y][x] == (levels[ly][lx])[y][x]",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                                  ,0x1ef,
                                  "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                                 );
                  }
                  lVar53 = lVar53 + 1;
                }
                lVar54 = lVar54 + 1;
                lVar51 = lVar51 + 2;
              }
              uVar45 = uVar45 + 1;
            } while (uVar45 != uVar16);
          }
          local_288 = (ulong *)((long)local_288 + 1);
        } while (local_288 != (ulong *)uVar36);
      }
      if (__s_00 != (ulong *)0x0) {
        if (*puVar40 == 0) {
          uVar36 = 8;
        }
        else {
          lVar27 = *puVar40 * 0x18;
          lVar46 = lVar27;
          do {
            if (*(void **)((long)puVar40 + lVar46) != (void *)0x0) {
              operator_delete__(*(void **)((long)puVar40 + lVar46));
            }
            lVar46 = lVar46 + -0x18;
          } while (lVar46 != 0);
          uVar36 = lVar27 + 8;
        }
        operator_delete__(puVar40,uVar36);
      }
      if (__s != (ulong *)0x0) {
        if (*puVar39 == 0) {
          uVar36 = 8;
        }
        else {
          lVar27 = *puVar39 * 0x18;
          lVar46 = lVar27;
          do {
            if (*(void **)((long)puVar39 + lVar46) != (void *)0x0) {
              operator_delete__(*(void **)((long)puVar39 + lVar46));
            }
            lVar46 = lVar46 + -0x18;
          } while (lVar46 != 0);
          uVar36 = lVar27 + 8;
        }
        operator_delete__(puVar39,uVar36);
      }
      if (local_268 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_268);
      }
      if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
      }
      if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0);
      }
      if (local_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0);
      }
      remove(_Var7._M_p);
      remove(_Var6._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      if (pAVar55 != (Array2D<Imath_3_2::half> *)0x0) {
        if (*puVar37 == 0) {
          uVar36 = 8;
        }
        else {
          lVar27 = *puVar37 * 0x18;
          lVar46 = lVar27;
          do {
            if (*(void **)((long)puVar37 + lVar46) != (void *)0x0) {
              operator_delete__(*(void **)((long)puVar37 + lVar46));
            }
            lVar46 = lVar46 + -0x18;
          } while (lVar46 != 0);
          uVar36 = lVar27 + 8;
        }
        operator_delete__(puVar37,uVar36);
      }
      Imf_3_4::Header::~Header(&hdr);
      uVar16 = 1;
      bVar8 = false;
    } while (bVar9);
    iVar17 = iVar17 + 1;
    if (iVar17 == 10) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename2._M_dataplus._M_p != &filename2.field_2) {
        operator_delete(filename2._M_dataplus._M_p,filename2.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename1._M_dataplus._M_p != &filename1.field_2) {
        operator_delete(filename1._M_dataplus._M_p,filename1.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void
writeCopyRead (
    const std::string& tempDir, int w, int h, int xs, int ys, int dx, int dy)
{
    std::string filename1 = tempDir + "imf_test_copy1.exr";
    std::string filename2 = tempDir + "imf_test_copy2.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
        for (int rmode = 0; rmode < NUM_ROUNDINGMODES; ++rmode)
        {
            writeCopyReadONE (
                filename1.c_str (),
                filename2.c_str (),
                w,
                h,
                xs,
                ys,
                dx,
                dy,
                Compression (comp),
                LevelRoundingMode (rmode));

            writeCopyReadMIP (
                filename1.c_str (),
                filename2.c_str (),
                w,
                h,
                xs,
                ys,
                dx,
                dy,
                Compression (comp),
                LevelRoundingMode (rmode));

            writeCopyReadRIP (
                filename1.c_str (),
                filename2.c_str (),
                w,
                h,
                xs,
                ys,
                dx,
                dy,
                Compression (comp),
                LevelRoundingMode (rmode));
        }
    }
}